

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::SortDescending
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this,
          vector<double,_std::allocator<double>_> *values)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  vector<double,_std::allocator<double>_> valuesDescending;
  allocator_type local_21;
  vector<double,_std::allocator<double>_> local_20;
  
  SortAscending(this,values);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_20,
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_21);
  pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pdVar2 - (long)pdVar1;
  if (lVar3 != 0) {
    pdVar4 = (double *)
             (lVar3 + -8 +
             (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start);
    uVar5 = 0;
    do {
      *pdVar4 = pdVar1[uVar5];
      uVar5 = uVar5 + 1;
      pdVar4 = pdVar4 + -1;
    } while ((long)pdVar2 - (long)pdVar1 >> 3 != (uVar5 & 0xffffffff));
  }
  std::vector<double,_std::allocator<double>_>::operator=(values,&local_20);
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SortDescending(std::vector<double> &values) const{
    SortAscending(values);
    
    // invert the sorting
    std::vector<double> valuesDescending(values.size());
    for(Index i=0;i!=values.size();++i)
        valuesDescending[values.size()-1-i]=values[i];
    values=valuesDescending;
}